

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chpst.c
# Opt level: O2

void euidgid(char *user,uint ext)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  char *m0;
  char bufnum [40];
  uidgid ugid;
  char acStack_138 [52];
  uidgid local_104;
  
  if (ext == 0) {
    uVar1 = uidgid_get(&local_104,user);
    if (uVar1 != 0) goto LAB_00103541;
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fatal("unable to get password file entry");
    }
    m0 = "unknown account";
  }
  else {
    uVar1 = uidgids_get(&local_104,user);
    if (uVar1 != 0) goto LAB_00103541;
    if (*user == ':') {
      fatalx("invalid uid/gids",user + 1);
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fatal("unable to get password/group file entry");
    }
    m0 = "unknown user/group";
  }
  fatalx(m0,user);
LAB_00103541:
  uVar1 = fmt_ulong(acStack_138,(ulong)local_104.gid[0]);
  acStack_138[uVar1] = '\0';
  iVar2 = pathexec_env("GID",acStack_138);
  if (iVar2 == 0) {
    die_nomem();
  }
  uVar1 = fmt_ulong(acStack_138,(ulong)local_104.uid);
  acStack_138[uVar1] = '\0';
  iVar2 = pathexec_env("UID",acStack_138);
  if (iVar2 == 0) {
    die_nomem();
  }
  return;
}

Assistant:

void euidgid(char *user, unsigned int ext) {
  struct uidgid ugid;
  char bufnum[FMT_ULONG];

  if (ext) {
    if (! uidgids_get(&ugid, user)) {
      if (*user == ':') fatalx("invalid uid/gids", user +1);
      if (errno) fatal("unable to get password/group file entry");
      fatalx("unknown user/group", user);
    }
  }
  else
    if (! uidgid_get(&ugid, user)) {
      if (errno) fatal("unable to get password file entry");
      fatalx("unknown account", user);
    }
  bufnum[fmt_ulong(bufnum, *ugid.gid)] =0;
  if (! pathexec_env("GID", bufnum)) die_nomem();
  bufnum[fmt_ulong(bufnum, ugid.uid)] =0;
  if (! pathexec_env("UID", bufnum)) die_nomem();
}